

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
valueByteSize(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  byte bVar4;
  ValueLength VVar5;
  byte *pbVar6;
  
  pbVar2 = *(byte **)this;
  bVar4 = 0;
  pbVar6 = pbVar2;
  do {
    bVar1 = *pbVar6;
    if ((bVar1 & 0xfe) != 0xee) break;
    uVar3 = (uint)(bVar1 == 0xef) * 9;
    if (bVar1 == 0xee) {
      uVar3 = 2;
    }
    bVar4 = bVar4 + (char)uVar3;
    pbVar6 = pbVar6 + uVar3;
  } while (uVar3 != 0);
  if ((ulong)"\x01\x01"[pbVar2[bVar4]] != 0) {
    return (ulong)"\x01\x01"[pbVar2[bVar4]];
  }
  VVar5 = byteSizeDynamic(this,pbVar2 + bVar4);
  return VVar5;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }